

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall cppgenerate::Printer::Printer(Printer *this,Printer *other)

{
  std::vector<cppgenerate::Class,_std::allocator<cppgenerate::Class>_>::vector
            (&this->m_classes,&other->m_classes);
  this->m_generateAsSingleFile = other->m_generateAsSingleFile;
  (this->m_outputDirectory)._M_dataplus._M_p = (pointer)&(this->m_outputDirectory).field_2;
  (this->m_outputDirectory)._M_string_length = 0;
  (this->m_outputDirectory).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Printer::Printer( const Printer& other ) :
    m_generateAsSingleFile( other.m_generateAsSingleFile ),
    m_classes( other.m_classes )
{}